

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_CommonExpr_Test::TestBody(ExprTest_CommonExpr_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  SafeBool SVar3;
  int __c;
  char *__s;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Reference e;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined1 success;
  AssertionResult *in_stack_fffffffffffffea0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  ExprBase in_stack_fffffffffffffeb0;
  AssertionResult *pAVar4;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int line;
  char *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  Type TVar5;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  char local_b8 [8];
  AssertionResult local_b0 [2];
  Kind local_90;
  undefined4 local_8c;
  AssertionResult local_88;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_78;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  mp::Reference::Reference((Reference *)0x11b03e);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffff18.ptr_,in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),TVar5,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               (char *)in_stack_fffffffffffffeb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x11b150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b1cb);
  local_70 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (Reference)in_stack_fffffffffffffeb0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  local_78.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr(in_stack_fffffffffffffe98,0);
  success = (undefined1)((ulong)in_stack_fffffffffffffe98 >> 0x38);
  local_8c = 3;
  local_10[0].impl_ = (Impl *)local_78.super_ExprBase.impl_;
  local_90 = mp::internal::ExprBase::kind((ExprBase *)0x11b235);
  pAVar4 = &local_88;
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (char *)in_stack_fffffffffffffeb0.impl_,
             (Kind *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (Kind *)in_stack_fffffffffffffea0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  TVar5 = (Type)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
    in_stack_fffffffffffffec0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11b2d2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffed0),TVar5,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               (char *)in_stack_fffffffffffffeb0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x11b32f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b384);
  SVar3 = mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  __s = (char *)(ulong)(SVar3 != 0);
  pAVar4 = local_b0;
  testing::AssertionResult::AssertionResult(in_stack_fffffffffffffea0,(bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffff18.ptr_,in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffed0),TVar5,
               in_stack_fffffffffffffec0,line,&pAVar4->success_);
    __s = local_b8;
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    testing::Message::~Message((Message *)0x11b49f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b517);
  mp::Reference::index((Reference *)local_10,__s,__c);
  this_00 = (AssertionResult *)&stack0xffffffffffffff10;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(line,in_stack_fffffffffffffeb8),&pAVar4->success_,
             (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
    testing::AssertionResult::failure_message((AssertionResult *)0x11b5b7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffed0),TVar5,
               in_stack_fffffffffffffec0,line,&pAVar4->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x11b603);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b64f);
  return;
}

Assistant:

TEST_F(ExprTest, CommonExpr) {
  mp::Reference e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  e = factory_.MakeCommonExpr(42);
  EXPECT_EQ(expr::COMMON_EXPR, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(42, e.index());
}